

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_init_table(fitsfile *outfptr,int inbitpix,int naxis,long *naxes,int writebitpix,
                     int *status)

{
  float fVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  bool bVar5;
  double dVar6;
  int secondDim;
  int firstDim;
  int noHigherDims;
  int nQualifyDims;
  int is_primary;
  long actual_tilesize [6];
  char comm [73];
  char *tunit [3];
  char tf2 [4];
  char tf1 [4];
  char tf0 [4];
  char *tform [3];
  char *ttype [3];
  long nrows;
  int bitpix;
  int ncols;
  int addToDim;
  int ndiv;
  int remain;
  int ii;
  char zcmptype [12];
  char keyname [75];
  int local_1bc;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 local_1a8 [4];
  long in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  fitsfile *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  void *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  fitsfile *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  char *fptr;
  char *keyname_00;
  char *fptr_00;
  char local_104 [4];
  char local_100 [4];
  char local_fc [4];
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  long local_b8;
  int local_ac;
  undefined4 local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  char local_94 [12];
  char local_88 [88];
  int *local_30;
  int local_24;
  long *local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  local_d8 = "COMPRESSED_DATA";
  local_d0 = "ZSCALE";
  local_c8 = "ZZERO";
  fptr = "";
  keyname_00 = "";
  fptr_00 = "";
  iVar10 = 0;
  iVar9 = 1;
  iVar7 = -1;
  local_1bc = -1;
  if (*in_R9 < 1) {
    local_30 = in_R9;
    if ((((-1 < in_ESI) || (fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x420), fVar1 != 9999.0)) ||
        (NAN(fVar1))) ||
       ((*(int *)(*(long *)(in_RDI + 8) + 1000) == 0x15 ||
        (*(int *)(*(long *)(in_RDI + 8) + 1000) == 0x16)))) {
      if (*(int *)(*(long *)(in_RDI + 8) + 1000) == 0) {
        *(undefined4 *)(*(long *)(in_RDI + 8) + 1000) = 0xb;
      }
      if ((in_ESI < 0) &&
         ((fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x420), fVar1 != 9999.0 || (NAN(fVar1))))) {
        if (*(int *)(*(long *)(in_RDI + 8) + 0x424) == 0) {
          *(undefined4 *)(*(long *)(in_RDI + 8) + 0x424) = 1;
        }
        fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x420);
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          if (*(int *)(*(long *)(in_RDI + 8) + 0x424) == -1) {
            *(undefined4 *)(*(long *)(in_RDI + 8) + 0x420) = 0x41800000;
          }
          else {
            *(undefined4 *)(*(long *)(in_RDI + 8) + 0x420) = 0x40800000;
          }
        }
      }
      if (in_ESI == 0x14) {
        local_ac = 0x10;
      }
      else if (in_ESI == 0x28) {
        local_ac = 0x20;
      }
      else {
        local_ac = in_ESI;
        if (in_ESI == 10) {
          local_ac = 8;
        }
      }
      local_24 = in_R8D;
      local_20 = in_RCX;
      local_18 = in_EDX;
      local_14 = in_ESI;
      local_10 = in_RDI;
      memcpy(local_1a8,(void *)(*(long *)(in_RDI + 8) + 0x3f0),0x30);
      if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0x29) {
        if (local_18 < 2) {
          ffpmsg((char *)0x1dfa02);
          *local_30 = 0x19d;
          return 0x19d;
        }
        for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
          if (3 < local_20[local_98]) {
            iVar10 = iVar10 + 1;
          }
        }
        if (iVar10 < 2) {
          ffpmsg((char *)0x1dfa85);
          *local_30 = 0x19d;
          return 0x19d;
        }
        for (local_98 = 1; local_98 < local_18; local_98 = local_98 + 1) {
          if ((*(long *)(local_1a8 + (long)local_98 * 8) != 0) &&
             (*(long *)(local_1a8 + (long)local_98 * 8) != 1)) {
            iVar9 = 0;
            break;
          }
        }
        if ((_local_1a8 < 1) && (in_stack_fffffffffffffe60 == -1)) {
          _local_1a8 = *local_20;
          in_stack_fffffffffffffe60 = local_20[1];
          for (local_98 = 2; local_98 < local_18; local_98 = local_98 + 1) {
            *(undefined8 *)(local_1a8 + (long)local_98 * 8) = 1;
          }
        }
        else if ((_local_1a8 < 1) && (iVar9 != 0)) {
          _local_1a8 = *local_20;
          if (local_20[1] < 0x1f) {
            in_stack_fffffffffffffe60 = local_20[1];
          }
          else if ((local_20[1] % 0x10 == 0) || (3 < local_20[1] % 0x10)) {
            in_stack_fffffffffffffe60 = 0x10;
          }
          else if ((local_20[1] % 0x18 == 0) || (3 < local_20[1] % 0x18)) {
            in_stack_fffffffffffffe60 = 0x18;
          }
          else if ((local_20[1] % 0x14 == 0) || (3 < local_20[1] % 0x14)) {
            in_stack_fffffffffffffe60 = 0x14;
          }
          else if ((local_20[1] % 0x1e == 0) || (3 < local_20[1] % 0x1e)) {
            in_stack_fffffffffffffe60 = 0x1e;
          }
          else if ((local_20[1] % 0x1c == 0) || (3 < local_20[1] % 0x1c)) {
            in_stack_fffffffffffffe60 = 0x1c;
          }
          else if ((local_20[1] % 0x1a == 0) || (3 < local_20[1] % 0x1a)) {
            in_stack_fffffffffffffe60 = 0x1a;
          }
          else if ((local_20[1] % 0x16 == 0) || (3 < local_20[1] % 0x16)) {
            in_stack_fffffffffffffe60 = 0x16;
          }
          else if ((local_20[1] % 0x12 == 0) || (3 < local_20[1] % 0x12)) {
            in_stack_fffffffffffffe60 = 0x12;
          }
          else if ((local_20[1] % 0xe == 0) || (3 < local_20[1] % 0xe)) {
            in_stack_fffffffffffffe60 = 0xe;
          }
          else {
            in_stack_fffffffffffffe60 = 0x11;
          }
        }
        else {
          if (_local_1a8 < 1) {
            _local_1a8 = *local_20;
          }
          for (local_98 = 1; local_98 < local_18; local_98 = local_98 + 1) {
            if (*(long *)(local_1a8 + (long)local_98 * 8) < 0) {
              *(long *)(local_1a8 + (long)local_98 * 8) = local_20[local_98];
            }
            else if (*(long *)(local_1a8 + (long)local_98 * 8) == 0) {
              *(undefined8 *)(local_1a8 + (long)local_98 * 8) = 1;
            }
          }
        }
        for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
          iVar8 = iVar7;
          if ((1 < *(long *)(local_1a8 + (long)local_98 * 8)) && (iVar8 = local_98, -1 < iVar7)) {
            if (-1 < local_1bc) {
              ffpmsg((char *)0x1dff4f);
              *local_30 = 0x19d;
              return 0x19d;
            }
            local_1bc = local_98;
            iVar8 = iVar7;
          }
          iVar7 = iVar8;
        }
        if ((iVar7 < 0) || (local_1bc < 0)) {
          ffpmsg((char *)0x1dffa3);
          *local_30 = 0x19d;
          return 0x19d;
        }
        if ((*(long *)(local_1a8 + (long)iVar7 * 8) < 4) ||
           (*(long *)(local_1a8 + (long)local_1bc * 8) < 4)) {
          ffpmsg((char *)0x1dffe7);
          *local_30 = 0x19d;
          return 0x19d;
        }
        local_9c = (int)(local_20[iVar7] % *(long *)(local_1a8 + (long)iVar7 * 8));
        if ((0 < local_9c) && (local_9c < 4)) {
          local_a0 = (int)(local_20[iVar7] / *(long *)(local_1a8 + (long)iVar7 * 8));
          dVar6 = ceil((double)local_9c / (double)local_a0);
          local_a4 = (int)dVar6;
          *(long *)(local_1a8 + (long)iVar7 * 8) =
               (long)(int)dVar6 + *(long *)(local_1a8 + (long)iVar7 * 8);
          local_9c = (int)(local_20[iVar7] % *(long *)(local_1a8 + (long)iVar7 * 8));
          if ((0 < local_9c) && (local_9c < 4)) {
            ffpmsg((char *)0x1e00ee);
            *local_30 = 0x19d;
            return 0x19d;
          }
        }
        local_9c = (int)(local_20[local_1bc] % *(long *)(local_1a8 + (long)local_1bc * 8));
        if ((0 < local_9c) && (local_9c < 4)) {
          local_a0 = (int)(local_20[local_1bc] / *(long *)(local_1a8 + (long)local_1bc * 8));
          dVar6 = ceil((double)local_9c / (double)local_a0);
          local_a4 = (int)dVar6;
          *(long *)(local_1a8 + (long)local_1bc * 8) =
               (long)(int)dVar6 + *(long *)(local_1a8 + (long)local_1bc * 8);
          local_9c = (int)(local_20[local_1bc] % *(long *)(local_1a8 + (long)local_1bc * 8));
          if ((0 < local_9c) && (local_9c < 4)) {
            ffpmsg((char *)0x1e01f7);
            *local_30 = 0x19d;
            return 0x19d;
          }
        }
      }
      for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
        if (local_98 == 0) {
          if (_local_1a8 < 1) {
            _local_1a8 = *local_20;
          }
        }
        else if (*(long *)(local_1a8 + (long)local_98 * 8) < 0) {
          *(long *)(local_1a8 + (long)local_98 * 8) = local_20[local_98];
        }
        else if (*(long *)(local_1a8 + (long)local_98 * 8) == 0) {
          *(undefined8 *)(local_1a8 + (long)local_98 * 8) = 1;
        }
      }
      if (*(int *)(*(long *)(local_10 + 8) + 0x430) == 0) {
        strcpy(local_fc,"1PB");
      }
      else {
        strcpy(local_fc,"1QB");
      }
      strcpy(local_100,"1D");
      strcpy(local_104,"1D");
      local_f8 = local_fc;
      local_f0 = local_100;
      local_e8 = local_104;
      local_b8 = 1;
      for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
        local_b8 = local_b8 *
                   ((local_20[local_98] + -1) / *(long *)(local_1a8 + (long)local_98 * 8) + 1);
      }
      if ((local_ac < 0) &&
         ((fVar1 = *(float *)(*(long *)(local_10 + 8) + 0x420), fVar1 != 9999.0 || (NAN(fVar1))))) {
        local_a8 = 3;
      }
      else {
        local_a8 = 1;
      }
      if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0xb) {
        strcpy(local_94,"RICE_1");
      }
      else if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0x15) {
        strcpy(local_94,"GZIP_1");
      }
      else if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0x16) {
        strcpy(local_94,"GZIP_2");
      }
      else if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0x33) {
        strcpy(local_94,"BZIP2_1");
      }
      else if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0x1f) {
        strcpy(local_94,"PLIO_1");
        if (*(int *)(*(long *)(local_10 + 8) + 0x430) == 0) {
          strcpy(local_f8,"1PI");
        }
        else {
          strcpy(local_f8,"1QI");
        }
      }
      else if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0x29) {
        strcpy(local_94,"HCOMPRESS_1");
      }
      else {
        if (*(int *)(*(long *)(local_10 + 8) + 1000) != -1) {
          ffpmsg((char *)0x1e05d0);
          *local_30 = 0x19d;
          return 0x19d;
        }
        strcpy(local_94,"NOCOMPRESS");
      }
      lVar3 = _local_1a8;
      bVar5 = *(int *)(*(long *)(local_10 + 8) + 0x54) == 0;
      uVar4 = (uint)bVar5;
      uVar2 = (ulong)_local_1a8 >> 0x20;
      iVar8 = (int)uVar2;
      _local_1a8 = lVar3;
      ffcrtb(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,iVar8,
             (char **)(ulong)CONCAT14(bVar5,iVar10),(char **)CONCAT44(iVar9,iVar7),
             (char **)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
      ffpkyl((fitsfile *)fptr,(char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)in_stack_fffffffffffffecc,(char *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
      if (local_24 != 0) {
        if (uVar4 != 0) {
          ffpkyl((fitsfile *)fptr,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (int)in_stack_fffffffffffffecc,(char *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        }
        ffpkyj((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        ffpkyj((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
          snprintf(local_88,0x4b,"ZNAXIS%d",(ulong)(local_98 + 1));
          ffpkyj((fitsfile *)fptr,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
      }
      for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
        snprintf(local_88,0x4b,"ZTILE%d",(ulong)(local_98 + 1));
        ffpkyj((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      }
      if (local_ac < 0) {
        fVar1 = *(float *)(*(long *)(local_10 + 8) + 0x420);
        if ((fVar1 != 9999.0) || (NAN(fVar1))) {
          if (*(int *)(*(long *)(local_10 + 8) + 0x424) == 0) {
            *(undefined4 *)(*(long *)(local_10 + 8) + 0x424) = 1;
          }
          if ((*(int *)(*(long *)(local_10 + 8) + 0x424) == 2) &&
             (iVar7 = strcmp(local_94,"HCOMPRESS_1"), iVar7 == 0)) {
            *(undefined4 *)(*(long *)(local_10 + 8) + 0x424) = 1;
            fprintf(_stderr,
                    "Warning: CFITSIO does not allow subtractive_dither_2 when using Hcompress algorithm.\nWill use subtractive_dither_1 instead.\n"
                   );
          }
          if (*(int *)(*(long *)(local_10 + 8) + 0x424) == 1) {
            ffpkys((fitsfile *)fptr,
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            ffpky(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,
                  in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                  &in_stack_fffffffffffffe70->HDUposition);
          }
          else if (*(int *)(*(long *)(local_10 + 8) + 0x424) == 2) {
            ffpkys((fitsfile *)fptr,
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            ffpky(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,
                  in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                  &in_stack_fffffffffffffe70->HDUposition);
            iVar7 = strcmp(local_94,"RICE_1");
            if (iVar7 == 0) {
              strcpy(local_94,"RICE_ONE");
            }
          }
          else if (*(int *)(*(long *)(local_10 + 8) + 0x424) == -1) {
            ffpkys((fitsfile *)fptr,
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          }
        }
        else {
          ffpkys((fitsfile *)fptr,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
      }
      ffpkys((fitsfile *)fptr,(char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0xb) {
        ffpkys((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        ffpkyj((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        ffpkys((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        if (local_ac == 8) {
          ffpkyj((fitsfile *)fptr,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
        else if (local_ac == 0x10) {
          ffpkyj((fitsfile *)fptr,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
        else {
          ffpkyj((fitsfile *)fptr,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
      }
      else if (*(int *)(*(long *)(local_10 + 8) + 1000) == 0x29) {
        ffpkys((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        ffpkye((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0
               ,in_stack_fffffffffffffeb8);
        ffpkys((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        ffpkyj((fitsfile *)fptr,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      }
      if (local_14 == 0x14) {
        strcpy(&stack0xfffffffffffffe88,"offset data range to that of unsigned short");
        ffpkyg((fitsfile *)fptr_00,keyname_00,(double)fptr,in_stack_fffffffffffffed4,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
        strcpy(&stack0xfffffffffffffe88,"default scaling factor");
        ffpkyg((fitsfile *)fptr_00,keyname_00,(double)fptr,in_stack_fffffffffffffed4,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
      }
      else if (local_14 == 10) {
        strcpy(&stack0xfffffffffffffe88,"offset data range to that of signed byte");
        ffpkyg((fitsfile *)fptr_00,keyname_00,(double)fptr,in_stack_fffffffffffffed4,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
        strcpy(&stack0xfffffffffffffe88,"default scaling factor");
        ffpkyg((fitsfile *)fptr_00,keyname_00,(double)fptr,in_stack_fffffffffffffed4,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
      }
      else if (local_14 == 0x28) {
        strcpy(&stack0xfffffffffffffe88,"offset data range to that of unsigned long");
        ffpkyg((fitsfile *)fptr_00,keyname_00,(double)fptr,in_stack_fffffffffffffed4,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
        strcpy(&stack0xfffffffffffffe88,"default scaling factor");
        ffpkyg((fitsfile *)fptr_00,keyname_00,(double)fptr,in_stack_fffffffffffffed4,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
      }
      local_4 = *local_30;
    }
    else {
      ffpmsg((char *)0x1df83d);
      *local_30 = 0x19d;
      local_4 = 0x19d;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int imcomp_init_table(fitsfile *outfptr,
        int inbitpix,
        int naxis,
        long *naxes,
	int writebitpix,    /* write the ZBITPIX, ZNAXIS, and ZNAXES keyword? */
        int *status)
/* 
  create a BINTABLE extension for the output compressed image.
*/
{
    char keyname[FLEN_KEYWORD], zcmptype[12];
    int ii,  remain,  ndiv, addToDim, ncols, bitpix;
    long nrows;
    char *ttype[] = {"COMPRESSED_DATA", "ZSCALE", "ZZERO"};
    char *tform[3];
    char tf0[4], tf1[4], tf2[4];
    char *tunit[] = {"\0",            "\0",            "\0"  };
    char comm[FLEN_COMMENT];
    long actual_tilesize[MAX_COMPRESS_DIM]; /* Actual size to use for tiles */
    int is_primary=0; /* Is this attempting to write to the primary? */
    int nQualifyDims=0; /* For Hcompress, number of image dimensions with required pixels. */
    int noHigherDims=1; /* Set to true if all tile dims other than x are size 1. */
    int firstDim=-1, secondDim=-1; /* Indices of first and second tiles dimensions
                                with width > 1 */
    
    if (*status > 0)
        return(*status);

    /* check for special case of losslessly compressing floating point */
    /* images.  Only compression algorithm that supports this is GZIP */
    if ( (inbitpix < 0) && ((outfptr->Fptr)->request_quantize_level == NO_QUANTIZE) ) {
       if (((outfptr->Fptr)->request_compress_type != GZIP_1) &&
           ((outfptr->Fptr)->request_compress_type != GZIP_2)) {
         ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_init_table)");
         return(*status = DATA_COMPRESSION_ERR);
       }
    }
 
     /* set default compression parameter values, if undefined */
    
    if ( (outfptr->Fptr)->request_compress_type == 0) {
	/* use RICE_1 by default */
	(outfptr->Fptr)->request_compress_type = RICE_1;
    }

    if (inbitpix < 0 && (outfptr->Fptr)->request_quantize_level != NO_QUANTIZE) {  
	/* set defaults for quantizing floating point images */
	if ( (outfptr->Fptr)->request_quantize_method == 0) {
	      /* set default dithering method */
              (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
	}

	if ( (outfptr->Fptr)->request_quantize_level == 0) {
	    if ((outfptr->Fptr)->request_quantize_method == NO_DITHER) {
	        /* must use finer quantization if no dithering is done */
	        (outfptr->Fptr)->request_quantize_level = 16; 
	    } else {
	        (outfptr->Fptr)->request_quantize_level = 4; 
	    }
        }
    }

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
/* do this in imcomp_get_compressed_image_par, instead
    if ( (outfptr->Fptr)->request_quantize_level != 0.)
        (outfptr->Fptr)->quantize_level = (outfptr->Fptr)->request_quantize_level;
*/
    /* test for the 2 special cases that represent unsigned integers */
    if (inbitpix == USHORT_IMG)
        bitpix = SHORT_IMG;
    else if (inbitpix == ULONG_IMG)
        bitpix = LONG_IMG;
    else if (inbitpix == SBYTE_IMG)
        bitpix = BYTE_IMG;
    else 
        bitpix = inbitpix;

    /* reset default tile dimensions too if required */
    memcpy(actual_tilesize, outfptr->Fptr->request_tilesize, MAX_COMPRESS_DIM * sizeof(long));

    if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1) {
         
         /* Tiles must ultimately have 2 (and only 2) dimensions, each with
             at least 4 pixels. First catch the case where the image
             itself won't allow this. */
         if (naxis < 2 ) {
            ffpmsg("Hcompress cannot be used with 1-dimensional images (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);
	 }
         for (ii=0; ii<naxis; ii++)
         {
            if (naxes[ii] >= 4)
               ++nQualifyDims;
         }
         if (nQualifyDims < 2)
         {
            ffpmsg("Hcompress minimum image dimension is 4 pixels (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);            
         }

         /* Handle 2 special cases for backwards compatibility.
            1) If both X and Y tile dims are set to full size, ignore
               any other requested dimensions and just set their sizes to 1. 
            2) If X is full size and all the rest are size 1, attempt to
               find a reasonable size for Y. All other 1-D tile specifications
               will be rejected. */
         for (ii=1; ii<naxis; ++ii)
            if (actual_tilesize[ii] != 0 && actual_tilesize[ii] != 1)
            {
               noHigherDims = 0;
               break;
            }

         if ((actual_tilesize[0] <= 0) &&
             (actual_tilesize[1] == -1) ){
	     
	    /* compress the whole image as a single tile */
             actual_tilesize[0] = naxes[0];
             actual_tilesize[1] = naxes[1];

              for (ii = 2; ii < naxis; ii++) {
	             /* set all higher tile dimensions = 1 */
                     actual_tilesize[ii] = 1;
	      }

         } else if ((actual_tilesize[0] <= 0) && noHigherDims) {
	     
             /*
              The Hcompress algorithm is inherently 2D in nature, so the row by row
	      tiling that is used for other compression algorithms is not appropriate.
	      If the image has less than 30 rows, then the entire image will be compressed
	      as a single tile.  Otherwise the tiles will consist of 16 rows of the image. 
	      This keeps the tiles to a reasonable size, and it also includes enough rows
	      to allow good compression efficiency.  If the last tile of the image 
	      happens to contain less than 4 rows, then find another tile size with
	      between 14 and 30 rows (preferably even), so that the last tile has 
	      at least 4 rows
	     */ 
	      
             /* 1st tile dimension is the row length of the image */
             actual_tilesize[0] = naxes[0];

              if (naxes[1] <= 30) {  /* use whole image if it is small */
                   actual_tilesize[1] = naxes[1];
	      } else {
                /* look for another good tile dimension */
	          if        (naxes[1] % 16 == 0 || naxes[1] % 16 > 3) {
                      actual_tilesize[1] = 16;
		  } else if (naxes[1] % 24 == 0 || naxes[1] % 24 > 3) {
                      actual_tilesize[1] = 24;
		  } else if (naxes[1] % 20 == 0 || naxes[1] % 20 > 3) {
                      actual_tilesize[1] = 20;
		  } else if (naxes[1] % 30 == 0 || naxes[1] % 30 > 3) {
                      actual_tilesize[1] = 30;
		  } else if (naxes[1] % 28 == 0 || naxes[1] % 28 > 3) {
                      actual_tilesize[1] = 28;
		  } else if (naxes[1] % 26 == 0 || naxes[1] % 26 > 3) {
                      actual_tilesize[1] = 26;
		  } else if (naxes[1] % 22 == 0 || naxes[1] % 22 > 3) {
                      actual_tilesize[1] = 22;
		  } else if (naxes[1] % 18 == 0 || naxes[1] % 18 > 3) {
                      actual_tilesize[1] = 18;
		  } else if (naxes[1] % 14 == 0 || naxes[1] % 14 > 3) {
                      actual_tilesize[1] = 14;
		  } else  {
                      actual_tilesize[1] = 17;
		  }
	      }
        } else {
           if (actual_tilesize[0] <= 0)
              actual_tilesize[0] = naxes[0];
           for (ii=1; ii<naxis; ++ii)
           {
              if (actual_tilesize[ii] < 0)
                 actual_tilesize[ii] = naxes[ii];
              else if (actual_tilesize[ii] == 0)
                 actual_tilesize[ii] = 1;
           }
        }
        
        for (ii=0; ii<naxis; ++ii)
        {
           if (actual_tilesize[ii] > 1)
           {
              if (firstDim < 0)
                 firstDim = ii;
              else if (secondDim < 0)
                 secondDim = ii;
              else
              {
                 ffpmsg("Hcompress tiles can only have 2 dimensions (imcomp_init_table)");
                 return(*status = DATA_COMPRESSION_ERR);
              }
           }
        }
        if (firstDim < 0 || secondDim < 0)
        {
            ffpmsg("Hcompress tiles must have 2 dimensions (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);
        }
        
        if (actual_tilesize[firstDim] < 4 || actual_tilesize[secondDim] < 4)
        {
           ffpmsg("Hcompress minimum tile dimension is 4 pixels (imcomp_init_table)");
           return (*status = DATA_COMPRESSION_ERR);
        }
	
        /* check if requested tile size causes the last tile to to have less than 4 pixels */
        remain = naxes[firstDim] % (actual_tilesize[firstDim]);  /* 1st dimension */
        if (remain > 0 && remain < 4) {
            ndiv = naxes[firstDim]/actual_tilesize[firstDim]; /* integer truncation is intentional */
            addToDim = ceil((double)remain/ndiv);
            (actual_tilesize[firstDim]) += addToDim; /* increase tile size */
	   
            remain = naxes[firstDim] % (actual_tilesize[firstDim]);
            if (remain > 0 && remain < 4) {
                ffpmsg("Last tile along 1st dimension has less than 4 pixels (imcomp_init_table)");
                return(*status = DATA_COMPRESSION_ERR);	
            }        
        }

        remain = naxes[secondDim] % (actual_tilesize[secondDim]);  /* 2nd dimension */
        if (remain > 0 && remain < 4) {
            ndiv = naxes[secondDim]/actual_tilesize[secondDim]; /* integer truncation is intentional */
            addToDim = ceil((double)remain/ndiv);
            (actual_tilesize[secondDim]) += addToDim; /* increase tile size */
	   
            remain = naxes[secondDim] % (actual_tilesize[secondDim]);
            if (remain > 0 && remain < 4) {
                ffpmsg("Last tile along 2nd dimension has less than 4 pixels (imcomp_init_table)");
                return(*status = DATA_COMPRESSION_ERR);	
            }        
        }

    } /* end, if HCOMPRESS_1 */
    
    for (ii = 0; ii < naxis; ii++) {
	if (ii == 0) { /* first axis is different */
	    if (actual_tilesize[ii] <= 0) {
                actual_tilesize[ii] = naxes[ii]; 
	    }
	} else {
	    if (actual_tilesize[ii] < 0) {
                actual_tilesize[ii] = naxes[ii];  /* negative value maean use whole length */
	    } else if (actual_tilesize[ii] == 0) {
                actual_tilesize[ii] = 1;  /* zero value means use default value = 1 */
	    }
	}
    }

    /* ---- set up array of TFORM strings -------------------------------*/
    if ( (outfptr->Fptr)->request_huge_hdu != 0) {
        strcpy(tf0, "1QB");
    } else {
        strcpy(tf0, "1PB");
    }
    strcpy(tf1, "1D");
    strcpy(tf2, "1D");

    tform[0] = tf0;
    tform[1] = tf1;
    tform[2] = tf2;

    /* calculate number of rows in output table */
    nrows = 1;
    for (ii = 0; ii < naxis; ii++)
    {
        nrows = nrows * ((naxes[ii] - 1)/ (actual_tilesize[ii]) + 1);
    }

    /* determine the default  number of columns in the output table */
    if (bitpix < 0 && (outfptr->Fptr)->request_quantize_level != NO_QUANTIZE)  
        ncols = 3;  /* quantized and scaled floating point image */
    else
        ncols = 1; /* default table has just one 'COMPRESSED_DATA' column */

    if ((outfptr->Fptr)->request_compress_type == RICE_1)
    {
        strcpy(zcmptype, "RICE_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == GZIP_1)
    {
        strcpy(zcmptype, "GZIP_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == GZIP_2)
    {
        strcpy(zcmptype, "GZIP_2");
    }
    else if ((outfptr->Fptr)->request_compress_type == BZIP2_1)
    {
        strcpy(zcmptype, "BZIP2_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == PLIO_1)
    {
        strcpy(zcmptype, "PLIO_1");
       /* the PLIO compression algorithm outputs short integers, not bytes */
        if ( (outfptr->Fptr)->request_huge_hdu != 0) {
            strcpy(tform[0], "1QI");
        } else {
            strcpy(tform[0], "1PI");
        }
    }
    else if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1)
    {
        strcpy(zcmptype, "HCOMPRESS_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == NOCOMPRESS)
    {
        strcpy(zcmptype, "NOCOMPRESS");
    }    
    else
    {
        ffpmsg("unknown compression type (imcomp_init_table)");
        return(*status = DATA_COMPRESSION_ERR);
    }

    /* If attempting to write compressed image to primary, the
       call to ffcrtb will increment Fptr->curhdu to 1.  Therefore
       we need to test now for setting is_primary */
    is_primary = (outfptr->Fptr->curhdu == 0);
    /* create the bintable extension to contain the compressed image */
    ffcrtb(outfptr, BINARY_TBL, nrows, ncols, ttype, 
                tform, tunit, 0, status);

    /* Add standard header keywords. */
    ffpkyl (outfptr, "ZIMAGE", 1, 
           "extension contains compressed image", status);  

    if (writebitpix) {
        /*  write the keywords defining the datatype and dimensions of */
	/*  the uncompressed image.  If not, these keywords will be */
        /*  copied later from the input uncompressed image  */
	
        if (is_primary)   
            ffpkyl (outfptr, "ZSIMPLE", 1,
			"file does conform to FITS standard", status);
        ffpkyj (outfptr, "ZBITPIX", bitpix,
			"data type of original image", status);
        ffpkyj (outfptr, "ZNAXIS", naxis,
			"dimension of original image", status);

        for (ii = 0;  ii < naxis;  ii++)
        {
            snprintf (keyname, FLEN_KEYWORD,"ZNAXIS%d", ii+1);
            ffpkyj (outfptr, keyname, naxes[ii],
			"length of original image axis", status);
        }
    }
                      
    for (ii = 0;  ii < naxis;  ii++)
    {
        snprintf (keyname, FLEN_KEYWORD,"ZTILE%d", ii+1);
        ffpkyj (outfptr, keyname, actual_tilesize[ii],
			"size of tiles to be compressed", status);
    }

    if (bitpix < 0) {
       
	if ((outfptr->Fptr)->request_quantize_level == NO_QUANTIZE) {
	    ffpkys(outfptr, "ZQUANTIZ", "NONE", 
	      "Lossless compression without quantization", status);
	} else {
	    
	    /* Unless dithering has been specifically turned off by setting */
	    /* request_quantize_method = -1, use dithering by default */
	    /* when quantizing floating point images. */
	
	    if ( (outfptr->Fptr)->request_quantize_method == 0) 
              (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
            
            /* HCompress must not use SUBTRACTIVE_DITHER_2. If user is requesting
               this, assign SUBTRACTIVE_DITHER_1 instead. */
            if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_2
              && !(strcmp(zcmptype,"HCOMPRESS_1"))) {
                 (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
               fprintf(stderr,"Warning: CFITSIO does not allow subtractive_dither_2 when using Hcompress algorithm.\nWill use subtractive_dither_1 instead.\n");
            }
                 
	    if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_1) {
	      ffpkys(outfptr, "ZQUANTIZ", "SUBTRACTIVE_DITHER_1", 
	        "Pixel Quantization Algorithm", status);

	      /* also write the associated ZDITHER0 keyword with a default value */
	      /* which may get updated later. */
              ffpky(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->request_dither_seed), 
	       "dithering offset when quantizing floats", status);
 
            } else if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_2) {
	      ffpkys(outfptr, "ZQUANTIZ", "SUBTRACTIVE_DITHER_2", 
	        "Pixel Quantization Algorithm", status);

	      /* also write the associated ZDITHER0 keyword with a default value */
	      /* which may get updated later. */
              ffpky(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->request_dither_seed), 
	       "dithering offset when quantizing floats", status);

	      if (!strcmp(zcmptype, "RICE_1"))  {
	        /* when using this new dithering method, change the compression type */
		/* to an alias, so that old versions of funpack will not be able to */
		/* created a corrupted uncompressed image. */
		/* ******* can remove this cludge after about June 2015, after most old versions of fpack are gone */
        	strcpy(zcmptype, "RICE_ONE");
	      }

            } else if ((outfptr->Fptr)->request_quantize_method == NO_DITHER) {
	      ffpkys(outfptr, "ZQUANTIZ", "NO_DITHER", 
	        "No dithering during quantization", status);
	    }

	}
    }

    ffpkys (outfptr, "ZCMPTYPE", zcmptype,
	          "compression algorithm", status);

    /* write any algorithm-specific keywords */
    if ((outfptr->Fptr)->request_compress_type == RICE_1)
    {
        ffpkys (outfptr, "ZNAME1", "BLOCKSIZE",
            "compression block size", status);

        /* for now at least, the block size is always 32 */
        ffpkyj (outfptr, "ZVAL1", 32,
			"pixels per block", status);

        ffpkys (outfptr, "ZNAME2", "BYTEPIX",
            "bytes per pixel (1, 2, 4, or 8)", status);

        if (bitpix == BYTE_IMG)
            ffpkyj (outfptr, "ZVAL2", 1,
			"bytes per pixel (1, 2, 4, or 8)", status);
        else if (bitpix == SHORT_IMG)
            ffpkyj (outfptr, "ZVAL2", 2,
			"bytes per pixel (1, 2, 4, or 8)", status);
        else 
            ffpkyj (outfptr, "ZVAL2", 4,
			"bytes per pixel (1, 2, 4, or 8)", status);

    }
    else if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1)
    {
        ffpkys (outfptr, "ZNAME1", "SCALE",
            "HCOMPRESS scale factor", status);
        ffpkye (outfptr, "ZVAL1", (outfptr->Fptr)->request_hcomp_scale,
		7, "HCOMPRESS scale factor", status);

        ffpkys (outfptr, "ZNAME2", "SMOOTH",
            "HCOMPRESS smooth option", status);
        ffpkyj (outfptr, "ZVAL2", (long) (outfptr->Fptr)->request_hcomp_smooth,
			"HCOMPRESS smooth option", status);
    }

    /* Write the BSCALE and BZERO keywords, if an unsigned integer image */
    if (inbitpix == USHORT_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned short");
        ffpkyg(outfptr, "BZERO", 32768., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (inbitpix == SBYTE_IMG)
    {
        strcpy(comm, "offset data range to that of signed byte");
        ffpkyg(outfptr, "BZERO", -128., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (inbitpix == ULONG_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned long");
        ffpkyg(outfptr, "BZERO", 2147483648., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }

    return(*status);
}